

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelController.cpp
# Opt level: O1

Channel __thiscall cali::ChannelController::create(ChannelController *this)

{
  size_type *psVar1;
  uint uVar2;
  element_type *peVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ChannelBody *chB;
  anon_union_8_7_33918203_for_value aVar5;
  undefined1 auVar6 [8];
  int iVar7;
  undefined4 extraout_var;
  size_t sVar8;
  _Rb_tree_node_base *p_Var9;
  Events *pEVar10;
  ostream *poVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _func_void *in_RSI;
  Channel CVar13;
  RuntimeConfig cfg;
  Attribute attr;
  Caliper c;
  RuntimeConfig local_2a0;
  _func_void *local_290;
  element_type *local_288;
  Attribute local_280;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  Caliper local_258;
  undefined1 local_238 [8];
  anon_union_8_7_33918203_for_value aaStack_230 [30];
  ios_base local_140 [264];
  int local_38;
  
  peVar3 = *(element_type **)(*(long *)(in_RSI + 8) + 0x90);
  if ((peVar3 == (element_type *)0x0) ||
     (uVar2 = (uint)(peVar3->name)._M_string_length,
     _Var12._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar2, (int)uVar2 < 1)) {
    RuntimeConfig::RuntimeConfig(&local_2a0);
    RuntimeConfig::allow_read_env(&local_2a0,SUB81(*(undefined8 *)(in_RSI + 8),0));
    RuntimeConfig::import
              (&local_2a0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(*(long *)(in_RSI + 8) + 0x28));
    Caliper::Caliper(&local_258);
    Caliper::create_channel
              ((Caliper *)local_238,(char *)&local_258,
               (RuntimeConfig *)**(undefined8 **)(in_RSI + 8));
    aVar5 = aaStack_230[0];
    auVar6 = local_238;
    lVar4 = *(long *)(in_RSI + 8);
    local_238 = (undefined1  [8])0x0;
    aaStack_230[0].v_uint = 0;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar4 + 0x90);
    *(undefined1 (*) [8])(lVar4 + 0x88) = auVar6;
    *(anon_union_8_7_33918203_for_value *)(lVar4 + 0x90) = aVar5;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    Channel::~Channel((Channel *)local_238);
    if ((*(long *)(*(long *)(in_RSI + 8) + 0x90) == 0) ||
       (*(int *)(*(long *)(*(long *)(in_RSI + 8) + 0x90) + 8) < 1)) {
      poVar11 = (ostream *)local_238;
      std::ofstream::ofstream(poVar11);
      local_38 = 0;
      iVar7 = Log::verbosity();
      if (local_38 <= iVar7) {
        poVar11 = Log::get_stream((Log *)local_238);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"ChannelController::create(): Could not create channel ",0x36);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(char *)**(undefined8 **)(in_RSI + 8),
                           (*(undefined8 **)(in_RSI + 8))[1]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      local_238 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_238 + (long)_VTT[-3]) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&aaStack_230[0].v_bool);
      std::ios_base::~ios_base(local_140);
      this->_vptr_ChannelController = (_func_int **)0x0;
      (this->mP).
      super___shared_ptr<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      _Var12._M_pi = extraout_RDX_01;
    }
    else {
      local_288 = (element_type *)this;
      (*(code *)**(undefined8 **)in_RSI)();
      lVar4 = *(long *)(in_RSI + 8);
      p_Var9 = *(_Rb_tree_node_base **)(lVar4 + 0x70);
      local_290 = in_RSI;
      if (p_Var9 != (_Rb_tree_node_base *)(lVar4 + 0x60)) {
        do {
          iVar7 = (*local_258.super_CaliperMetadataAccessInterface.
                    _vptr_CaliperMetadataAccessInterface[4])(&local_258,p_Var9 + 1,4,0x640,0,0,0);
          local_280.m_node = (Node *)CONCAT44(extraout_var,iVar7);
          chB = *(ChannelBody **)(lVar4 + 0x88);
          aVar5 = (anon_union_8_7_33918203_for_value)
                  ((anon_union_8_7_33918203_for_value *)(p_Var9 + 2))->unmanaged_ptr;
          sVar8 = strlen((char *)aVar5.unmanaged_ptr);
          local_238 = (undefined1  [8])
                      ((sVar8 << 0x20) +
                       (ulong)(((uint)((byte *)(aVar5.v_uint - 1))[sVar8] |
                               (uint)*(byte *)((long)aVar5.unmanaged_ptr + (sVar8 >> 1)) << 8 |
                               (uint)*aVar5.unmanaged_ptr << 0x10) << 8) + 4);
          aaStack_230[0] = aVar5;
          Caliper::set(&local_258,chB,&local_280,(Variant *)local_238);
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while (p_Var9 != (_Rb_tree_node_base *)(lVar4 + 0x60));
      }
      pEVar10 = Channel::events((Channel *)(*(long *)(local_290 + 8) + 0x88));
      local_278._8_8_ = 0;
      local_278._M_unused._M_function_pointer = local_290;
      pcStack_260 = std::
                    _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/ChannelController.cpp:102:45)>
                    ::_M_invoke;
      local_268 = std::
                  _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/ChannelController.cpp:102:45)>
                  ::_M_manager;
      std::
      vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
      ::push_back(&(pEVar10->finish_evt).mCb,(value_type *)&local_278);
      this = (ChannelController *)local_288;
      _Var12._M_pi = extraout_RDX;
      if (local_268 != (code *)0x0) {
        (*local_268)(&local_278,&local_278,__destroy_functor);
        _Var12._M_pi = extraout_RDX_00;
      }
      lVar4 = *(long *)(local_290 + 8);
      ((element_type *)this)->id = (cali_id_t)*(_func_int ***)(lVar4 + 0x88);
      peVar3 = *(element_type **)(lVar4 + 0x90);
      ((__shared_ptr<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2> *)
      &(((element_type *)this)->name)._M_dataplus)->_M_ptr = peVar3;
      if (peVar3 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          psVar1 = &(peVar3->name)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
          UNLOCK();
        }
        else {
          psVar1 = &(peVar3->name)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
        }
      }
    }
    if (local_2a0.mP.
        super___shared_ptr<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2a0.mP.
                 super___shared_ptr<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      _Var12._M_pi = extraout_RDX_02;
    }
  }
  else {
    this->_vptr_ChannelController = *(_func_int ***)(*(long *)(in_RSI + 8) + 0x88);
    (this->mP).
    super___shared_ptr<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar3;
    if (peVar3 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(peVar3->name)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(peVar3->name)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
  }
  CVar13.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  CVar13.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Channel)CVar13.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Channel ChannelController::create()
{
    if (mP->channel)
        return mP->channel;

    RuntimeConfig cfg;

    cfg.allow_read_env(mP->flags & CALI_CHANNEL_ALLOW_READ_ENV);
    cfg.import(mP->config);

    Caliper c;

    mP->channel = c.create_channel(mP->name.c_str(), cfg);

    if (!mP->channel) {
        Log(0).stream() << "ChannelController::create(): Could not create channel " << mP->name << std::endl;
        return Channel();
    }

    on_create(&c, mP->channel);
    add_channel_metadata(c, mP->channel, mP->metadata);

    //   Reset the object's channel pointer if the channel is destroyed
    // behind our back (e.g., in Caliper::release())
    mP->channel.events().finish_evt.connect([this](Caliper*, Channel*) { mP->channel = Channel(); });

    return mP->channel;
}